

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

bool __thiscall jrtplib::RTCPSDESPacket::GotoFirstChunk(RTCPSDESPacket *this)

{
  int iVar1;
  RTCPSDESPacket *this_local;
  
  iVar1 = GetChunkCount(this);
  if (iVar1 != 0) {
    this->currentchunk = (this->super_RTCPPacket).data + 4;
    this->curchunknum = 1;
    this->itemoffset = 4;
  }
  else {
    this->currentchunk = (uint8_t *)0x0;
  }
  return iVar1 != 0;
}

Assistant:

inline bool RTCPSDESPacket::GotoFirstChunk()
{
	if (GetChunkCount() == 0)
	{
		currentchunk = 0;
		return false;
	}
	currentchunk = data+sizeof(RTCPCommonHeader);
	curchunknum = 1;
	itemoffset = sizeof(uint32_t);
	return true;
}